

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::ArrayMinMaxMethod::~ArrayMinMaxMethod(ArrayMinMaxMethod *this)

{
  SystemSubroutine::~SystemSubroutine(&this->super_SystemSubroutine);
  operator_delete(this,0x40);
  return;
}

Assistant:

ArrayMinMaxMethod(KnownSystemName knownNameId, bool isMin) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), isMin(isMin) {
        withClauseMode = WithClauseMode::Iterator;
    }